

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::draw_arrays_instanced(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  ContextType ctxType;
  mapped_type *pmVar2;
  GLuint fbo;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  StringTemplate local_260;
  string local_240;
  string local_220;
  StringTemplate local_200;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ProgramSources local_1b0;
  ShaderProgram program;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  fbo = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"GLSL_VERSION_STRING",(allocator<char> *)&local_1b0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&program);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&program);
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,
             "${GLSL_VERSION_STRING}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             &local_2a1);
  tcu::StringTemplate::StringTemplate(&local_200,&local_220);
  tcu::StringTemplate::specialize(&local_2a0,&local_200,&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "${GLSL_VERSION_STRING}\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,&local_2a2);
  tcu::StringTemplate::StringTemplate(&local_260,&local_280);
  tcu::StringTemplate::specialize(&local_240,&local_260,&args);
  glu::makeVtxFragSources(&local_1b0,&local_2a0,&local_240);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_240);
  tcu::StringTemplate::~StringTemplate(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  tcu::StringTemplate::~StringTemplate(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glVertexAttribDivisor(&ctx->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"GL_INVALID_ENUM is generated if mode is not an accepted value.",
             (allocator<char> *)&local_2a0);
  NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0xffffffff,0,1,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "GL_INVALID_VALUE is generated if count or primcount are negative.",
             (allocator<char> *)&local_2a0);
  NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0,0,-1,1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0,0,1,-1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,(allocator<char> *)&local_2a0);
  NegativeTestContext::beginSection(ctx,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0,0,1,1);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args._M_t);
  return;
}

Assistant:

void draw_arrays_instanced (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	GLuint						fbo		= 0;
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	glu::ShaderProgram			program	(ctx.getRenderContext(), glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderSource).specialize(args), tcu::StringTemplate(fragmentShaderSource).specialize(args)));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);
	ctx.glVertexAttribDivisor(0, 1);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawArraysInstanced(-1, 0, 1, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count or primcount are negative.");
	ctx.glDrawArraysInstanced(GL_POINTS, 0, -1, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDrawArraysInstanced(GL_POINTS, 0, 1, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawArraysInstanced(GL_POINTS, 0, 1, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();

	ctx.glUseProgram(0);
}